

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O0

optional<unsigned_char> ToIntegral<unsigned_char>(string_view str)

{
  optional<unsigned_char> *this;
  uchar *__t;
  const_pointer pvVar1;
  const_pointer pvVar2;
  size_type sVar3;
  char *in_RSI;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<unsigned_char> _Var4;
  char *first_nonmatching;
  uchar result;
  undefined6 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9e;
  undefined8 in_stack_ffffffffffffffb8;
  int __base;
  uchar *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  _Optional_payload_base<unsigned_char> local_a;
  long local_8;
  
  __base = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (optional<unsigned_char> *)
         std::basic_string_view<char,_std::char_traits<char>_>::data
                   ((basic_string_view<char,_std::char_traits<char>_> *)
                    CONCAT26(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98));
  __t = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::data
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            CONCAT26(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98));
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT26(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98));
  _Var4 = std::from_chars<unsigned_char>
                    (in_RSI,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,__base);
  pvVar1 = _Var4.ptr;
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)
                      CONCAT26(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98));
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT26(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98));
  if ((pvVar1 == pvVar2 + sVar3) && (_Var4.ec == 0)) {
    std::optional<unsigned_char>::optional<unsigned_char,_true>(this,__t);
  }
  else {
    std::optional<unsigned_char>::optional((optional<unsigned_char> *)&local_a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (_Optional_base<unsigned_char,_true,_true>)
           (_Optional_base<unsigned_char,_true,_true>)local_a;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<T> ToIntegral(std::string_view str)
{
    static_assert(std::is_integral<T>::value);
    T result;
    const auto [first_nonmatching, error_condition] = std::from_chars(str.data(), str.data() + str.size(), result);
    if (first_nonmatching != str.data() + str.size() || error_condition != std::errc{}) {
        return std::nullopt;
    }
    return result;
}